

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall t_js_generator::close_generator(t_js_generator *this)

{
  int in_ESI;
  
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_types_,in_ESI);
  if (this->gen_ts_ == true) {
    if ((this->ts_module_)._M_string_length != 0) {
      in_ESI = 0x3a07c7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_types_ts_,"}",1);
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_types_ts_,in_ESI);
  }
  if (this->gen_episode_file_ == true) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_episode_,in_ESI);
    return;
  }
  return;
}

Assistant:

void t_js_generator::close_generator() {
  // Close types file(s)

  f_types_.close();

  if (gen_ts_) {
    if (!ts_module_.empty()) {
      f_types_ts_ << "}";
    }
    f_types_ts_.close();
  }
  if (gen_episode_file_){
    f_episode_.close();
  }
}